

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexTestTest.cpp
# Opt level: O0

void __thiscall RegexTestTest::RegexTestTest(RegexTestTest *this)

{
  shared_ptr<oout::StringText> local_c8;
  shared_ptr<oout::StringText> local_b8;
  shared_ptr<oout::EqualTest> local_a8;
  shared_ptr<oout::NamedTest> local_98;
  shared_ptr<oout::StringText> local_88;
  shared_ptr<oout::StringText> local_78;
  shared_ptr<oout::EqualTest> local_68;
  shared_ptr<oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  RegexTestTest *local_10;
  RegexTestTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"RegexTest test",&local_31)
  ;
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])&local_88);
  std::make_unique<oout::RegexTest,std::shared_ptr<oout::StringText>,char_const(&)[5]>
            (&local_78,(char (*) [5])&local_88);
  std::make_unique<TestText,std::unique_ptr<oout::RegexTest,std::default_delete<oout::RegexTest>>>
            ((unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)
             &local_78.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_68,
             (char (*) [8])
             &local_78.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<oout::NamedTest,char_const(&)[29],std::shared_ptr<oout::EqualTest>>
            ((char (*) [29])local_58,(shared_ptr<oout::EqualTest> *)"RegexTest success if matched");
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])&local_c8);
  std::make_unique<oout::RegexTest,std::shared_ptr<oout::StringText>,char_const(&)[4]>
            (&local_b8,(char (*) [4])&local_c8);
  std::make_unique<TestText,std::unique_ptr<oout::RegexTest,std::default_delete<oout::RegexTest>>>
            ((unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)
             &local_b8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_a8,
             (char (*) [8])
             &local_b8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<oout::NamedTest,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            ((char (*) [31])&local_98,
             (shared_ptr<oout::EqualTest> *)"RegexTest failure if not match");
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_30,local_58,&local_98);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_98);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_a8);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)
             &local_b8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_>::~unique_ptr
            ((unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)&local_b8);
  std::shared_ptr<oout::StringText>::~shared_ptr(&local_c8);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_68);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)
             &local_78.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_>::~unique_ptr
            ((unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)&local_78);
  std::shared_ptr<oout::StringText>::~shared_ptr(&local_88);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__RegexTestTest_00324760;
  return;
}

Assistant:

RegexTestTest::RegexTestTest()
: dirty::Test(
	"RegexTest test",
	make_shared<NamedTest>(
		"RegexTest success if matched",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<RegexTest>(
					make_shared<StringText>("test"),
					"t.+t"
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"RegexTest failure if not match",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<RegexTest>(
					make_shared<StringText>("test"),
					R"(\d+)"
				)
			),
			"failure"
		)
	)
)
{
}